

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O2

void __thiscall leveldb::Histogram::Add(Histogram *this,double value)

{
  long lVar1;
  
  for (lVar1 = 0; (lVar1 != 0x4c8 && (*(double *)((long)&kBucketLimit + lVar1) <= value));
      lVar1 = lVar1 + 8) {
  }
  *(double *)((long)this->buckets_ + lVar1) = *(double *)((long)this->buckets_ + lVar1) + 1.0;
  if (value < this->min_) {
    this->min_ = value;
  }
  if (this->max_ <= value && value != this->max_) {
    this->max_ = value;
  }
  this->num_ = this->num_ + 1.0;
  this->sum_ = value + this->sum_;
  this->sum_squares_ = value * value + this->sum_squares_;
  return;
}

Assistant:

void Histogram::Add(double value) {
  // Linear search is fast enough for our usage in db_bench
  int b = 0;
  while (b < kNumBuckets - 1 && kBucketLimit[b] <= value) {
    b++;
  }
  buckets_[b] += 1.0;
  if (min_ > value) min_ = value;
  if (max_ < value) max_ = value;
  num_++;
  sum_ += value;
  sum_squares_ += (value * value);
}